

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

char * __thiscall
TestMemoryAllocator::alloc_memory
          (TestMemoryAllocator *this,size_t size,char *param_3,size_t param_4)

{
  char *pcVar1;
  size_t unaff_retaddr;
  
  pcVar1 = checkedMalloc(unaff_retaddr);
  return pcVar1;
}

Assistant:

char* TestMemoryAllocator::alloc_memory(size_t size, const char*, size_t)
{
    return checkedMalloc(size);
}